

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

void __thiscall cmFileLockPool::PushFunctionScope(cmFileLockPool *this)

{
  pointer *pppSVar1;
  iterator __position;
  ScopePool *local_10;
  
  local_10 = (ScopePool *)operator_new(0x18);
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_10->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (this->FunctionScopes).
       super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->FunctionScopes).
      super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>::
    _M_realloc_insert<cmFileLockPool::ScopePool*>
              ((vector<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>> *)this
               ,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppSVar1 = &(this->FunctionScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return;
}

Assistant:

void cmFileLockPool::PushFunctionScope()
{
  this->FunctionScopes.push_back(new ScopePool());
}